

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_pink.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  PaDeviceInfo *pPVar1;
  char *pcVar2;
  float fVar3;
  int local_260;
  float pink;
  int i;
  int totalSamps;
  PaStreamParameters outputParameters;
  paTestData data;
  PaStream *pPStack_18;
  PaError err;
  PaStream *stream;
  
  stream._4_4_ = 0;
  InitializePinkNoise((PinkNoise *)&outputParameters.hostApiSpecificStreamInfo,0xc);
  InitializePinkNoise((PinkNoise *)&data.leftPink.pink_Scalar,0x10);
  for (local_260 = 0; local_260 < 0x14; local_260 = local_260 + 1) {
    fVar3 = GeneratePinkNoise((PinkNoise *)&outputParameters.hostApiSpecificStreamInfo);
    printf("Pink = %f\n",(double)fVar3);
  }
  data.rightPink.pink_Scalar = 3.707836e-39;
  data._532_4_ = Pa_Initialize();
  if (data._532_4_ == 0) {
    i = Pa_GetDefaultOutputDevice();
    if (i == -1) {
      fprintf(_stderr,"Error: No default output device.\n");
    }
    else {
      totalSamps = 2;
      outputParameters.suggestedLatency = 0.0;
      outputParameters.device = 1;
      outputParameters.channelCount = 0;
      pPVar1 = Pa_GetDeviceInfo(i);
      outputParameters.sampleFormat = (PaSampleFormat)pPVar1->defaultLowOutputLatency;
      data._532_4_ = Pa_OpenStream(&stack0xffffffffffffffe8,(PaStreamParameters *)0x0,
                                   (PaStreamParameters *)&i,44100.0,0x800,1,patestCallback,
                                   &outputParameters.hostApiSpecificStreamInfo);
      if ((data._532_4_ == 0) && (data._532_4_ = Pa_StartStream(pPStack_18), data._532_4_ == 0)) {
        printf("Stereo pink noise for one minute...\n");
        while (data._532_4_ = Pa_IsStreamActive(pPStack_18), data._532_4_ == 1) {
          Pa_Sleep(100);
        }
        if ((-1 < (int)data._532_4_) &&
           (data._532_4_ = Pa_CloseStream(pPStack_18), data._532_4_ == 0)) {
          printf("Pink min = %f, max = %f\n",(double)pinkMin,(double)pinkMax);
          Pa_Terminate();
          return 0;
        }
      }
    }
  }
  Pa_Terminate();
  fprintf(_stderr,"An error occured while using the portaudio stream\n");
  fprintf(_stderr,"Error number: %d\n",(ulong)(uint)data._532_4_);
  __stream = _stderr;
  pcVar2 = Pa_GetErrorText(data._532_4_);
  fprintf(__stream,"Error message: %s\n",pcVar2);
  return 0;
}

Assistant:

int main(void)
{
    PaStream*           stream;
    PaError             err;
    paTestData          data;
    PaStreamParameters  outputParameters;
    int                 totalSamps;
    static const double SR  = 44100.0;
    static const int    FPB = 2048; /* Frames per buffer: 46 ms buffers. */
    
    /* Initialize two pink noise signals with different numbers of rows. */
    InitializePinkNoise( &data.leftPink,  12 );
    InitializePinkNoise( &data.rightPink, 16 );

    /* Look at a few values. */
    {
        int i;
        float pink;
        for( i=0; i<20; i++ )
        {
            pink = GeneratePinkNoise( &data.leftPink );
            printf("Pink = %f\n", pink );
        }
    }

    data.sampsToGo = totalSamps = (int)(60.0 * SR);   /* Play a whole minute. */
    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    /* Open a stereo PortAudio stream so we can hear the result. */
    outputParameters.device = Pa_GetDefaultOutputDevice(); /* Take the default output device. */
    if (outputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default output device.\n");
      goto error;
    }
    outputParameters.channelCount = 2;                     /* Stereo output, most likely supported. */
    outputParameters.hostApiSpecificStreamInfo = NULL;
    outputParameters.sampleFormat = paFloat32;             /* 32 bit floating point output. */
    outputParameters.suggestedLatency =
                     Pa_GetDeviceInfo(outputParameters.device)->defaultLowOutputLatency;
    err = Pa_OpenStream(&stream,
                        NULL,                              /* No input. */
                        &outputParameters,
                        SR,                                /* Sample rate. */
                        FPB,                               /* Frames per buffer. */
                        paClipOff, /* we won't output out of range samples so don't bother clipping them */
                        patestCallback,
                        &data);
    if( err != paNoError ) goto error;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error;

    printf("Stereo pink noise for one minute...\n");

    while( ( err = Pa_IsStreamActive( stream ) ) == 1 ) Pa_Sleep(100);
    if( err < 0 ) goto error;

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;
#ifdef PINK_MEASURE
    printf("Pink min = %f, max = %f\n", pinkMin, pinkMax );
#endif
    Pa_Terminate();
    return 0;
error:
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return 0;
}